

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O1

int nsvg__parseTransformArgs(char *str,float *args,int maxNa,int *na)

{
  byte bVar1;
  byte *s;
  int extraout_EDX;
  int iVar2;
  long lVar3;
  double dVar4;
  char it [64];
  char local_78 [72];
  
  *na = 0;
  for (lVar3 = 0; str[lVar3] != '\0'; lVar3 = lVar3 + 1) {
    if (str[lVar3] == '(') {
      s = (byte *)(str + lVar3);
      goto LAB_00116919;
    }
  }
LAB_0011692c:
  lVar3 = 1;
  goto LAB_00116931;
LAB_00116919:
  if (str[lVar3] == '\0') goto LAB_0011692c;
  if (str[lVar3] == ')') {
    if (str + lVar3 <= s) goto LAB_00116931;
    iVar2 = maxNa;
    goto LAB_0011694f;
  }
  lVar3 = lVar3 + 1;
  goto LAB_00116919;
LAB_0011694f:
  do {
    bVar1 = *s;
    if ((((ulong)bVar1 < 0x2f) && ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       (0xf5 < (byte)(bVar1 - 0x3a))) {
      if (maxNa <= *na) {
        lVar3 = 0;
        break;
      }
      s = (byte *)nsvg__parseNumber((char *)s,local_78,iVar2);
      dVar4 = nsvg__atof(local_78);
      iVar2 = *na;
      *na = iVar2 + 1;
      args[iVar2] = (float)dVar4;
      iVar2 = extraout_EDX;
    }
    else {
      s = s + 1;
    }
  } while (s < str + lVar3);
LAB_00116931:
  return (int)lVar3;
}

Assistant:

static int nsvg__parseTransformArgs(const char* str, float* args, int maxNa, int* na)
{
	const char* end;
	const char* ptr;
	char it[64];

	*na = 0;
	ptr = str;
	while (*ptr && *ptr != '(') ++ptr;
	if (*ptr == 0)
		return 1;
	end = ptr;
	while (*end && *end != ')') ++end;
	if (*end == 0)
		return 1;

	while (ptr < end) {
		if (*ptr == '-' || *ptr == '+' || *ptr == '.' || nsvg__isdigit(*ptr)) {
			if (*na >= maxNa) return 0;
			ptr = nsvg__parseNumber(ptr, it, 64);
			args[(*na)++] = (float)nsvg__atof(it);
		} else {
			++ptr;
		}
	}
	return (int)(end - str);
}